

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

TSpirvInstruction * __thiscall
glslang::TParseContext::mergeSpirvInstruction
          (TParseContext *this,TSourceLoc *loc,TSpirvInstruction *spirvInst1,
          TSpirvInstruction *spirvInst2)

{
  bool bVar1;
  TSpirvInstruction *spirvInst2_local;
  TSpirvInstruction *spirvInst1_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          empty(&spirvInst2->set);
  if (!bVar1) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::empty(&spirvInst1->set);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=(&spirvInst1->set,&spirvInst2->set);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many SPIR-V instruction qualifiers","spirv_instruction","(set)");
    }
  }
  if (spirvInst2->id != -1) {
    if (spirvInst1->id == -1) {
      spirvInst1->id = spirvInst2->id;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many SPIR-V instruction qualifiers","spirv_instruction","(id)");
    }
  }
  return spirvInst1;
}

Assistant:

TSpirvInstruction* TParseContext::mergeSpirvInstruction(const TSourceLoc& loc, TSpirvInstruction* spirvInst1, TSpirvInstruction* spirvInst2)
{
    // Merge qualifiers of the second SPIR-V instruction to those of the first one
    if (!spirvInst2->set.empty()) {
        if (spirvInst1->set.empty())
            spirvInst1->set = spirvInst2->set;
        else
            error(loc, "too many SPIR-V instruction qualifiers", "spirv_instruction", "(set)");
    }

    if (spirvInst2->id != -1) {
        if (spirvInst1->id == -1)
            spirvInst1->id = spirvInst2->id;
        else
            error(loc, "too many SPIR-V instruction qualifiers", "spirv_instruction", "(id)");
    }

    return spirvInst1;
}